

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.h
# Opt level: O0

void __thiscall
Js::IndexPropertyDescriptor::IndexPropertyDescriptor
          (IndexPropertyDescriptor *this,Var getter,Var setter)

{
  Var setter_local;
  Var getter_local;
  IndexPropertyDescriptor *this_local;
  
  this->Attributes = '\a';
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Getter,getter);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->Setter,setter);
  return;
}

Assistant:

IndexPropertyDescriptor(Var getter, Var setter)
            : Attributes(PropertyDynamicTypeDefaults), Getter(getter), Setter(setter)
        {
        }